

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O0

void Abc_SclWriteSurfaceText(FILE *s,SC_Surface *p)

{
  int iVar1;
  Vec_Flt_t *p_00;
  char *pcVar2;
  bool bVar3;
  float fVar4;
  int local_2c;
  int local_28;
  int k;
  int i;
  float Entry;
  Vec_Flt_t *vVec;
  SC_Surface *p_local;
  FILE *s_local;
  
  fprintf((FILE *)s,"          index_1(\"");
  for (local_28 = 0; iVar1 = Vec_FltSize(&p->vIndex0), local_28 < iVar1; local_28 = local_28 + 1) {
    fVar4 = Vec_FltEntry(&p->vIndex0,local_28);
    iVar1 = Vec_FltSize(&p->vIndex0);
    pcVar2 = "    \"%s\", ";
    if (local_28 == iVar1 + -1) {
      pcVar2 = "T = %d\t\t";
    }
    fprintf((FILE *)s,"%f%s",(double)fVar4,pcVar2 + 8);
  }
  fprintf((FILE *)s,"\");\n");
  fprintf((FILE *)s,"          index_2(\"");
  for (local_28 = 0; iVar1 = Vec_FltSize(&p->vIndex1), local_28 < iVar1; local_28 = local_28 + 1) {
    fVar4 = Vec_FltEntry(&p->vIndex1,local_28);
    iVar1 = Vec_FltSize(&p->vIndex1);
    pcVar2 = "    \"%s\", ";
    if (local_28 == iVar1 + -1) {
      pcVar2 = "T = %d\t\t";
    }
    fprintf((FILE *)s,"%f%s",(double)fVar4,pcVar2 + 8);
  }
  fprintf((FILE *)s,"\");\n");
  fprintf((FILE *)s,"          values (\"");
  for (local_28 = 0; iVar1 = Vec_PtrSize(&p->vData), local_28 < iVar1; local_28 = local_28 + 1) {
    p_00 = (Vec_Flt_t *)Vec_PtrEntry(&p->vData,local_28);
    for (local_2c = 0; iVar1 = Vec_FltSize(p_00), local_2c < iVar1; local_2c = local_2c + 1) {
      fVar4 = Vec_FltEntry(p_00,local_2c);
      iVar1 = Vec_PtrSize(&p->vData);
      bVar3 = false;
      if (local_28 == iVar1 + -1) {
        iVar1 = Vec_FltSize(p_00);
        bVar3 = local_2c == iVar1 + -1;
      }
      pcVar2 = ", ";
      if (bVar3) {
        pcVar2 = "\");";
      }
      fprintf((FILE *)s,"%f%s",(double)fVar4,pcVar2);
    }
    iVar1 = Vec_PtrSize(&p->vData);
    if (local_28 == iVar1 + -1) {
      fprintf((FILE *)s,"\n");
    }
    else {
      fprintf((FILE *)s,"\\\n");
      fprintf((FILE *)s,"                   ");
    }
  }
  return;
}

Assistant:

static void Abc_SclWriteSurfaceText( FILE * s, SC_Surface * p )
{
    Vec_Flt_t * vVec;
    float Entry;
    int i, k;

    fprintf( s, "          index_1(\"" );  
    Vec_FltForEachEntry( &p->vIndex0, Entry, i )
        fprintf( s, "%f%s", Entry, i == Vec_FltSize(&p->vIndex0)-1 ? "":", " );
    fprintf( s, "\");\n" );

    fprintf( s, "          index_2(\"" );  
    Vec_FltForEachEntry( &p->vIndex1, Entry, i )
        fprintf( s, "%f%s", Entry, i == Vec_FltSize(&p->vIndex1)-1 ? "":", " );
    fprintf( s, "\");\n" );

    fprintf( s, "          values (\"" );  
    Vec_PtrForEachEntry( Vec_Flt_t *, &p->vData, vVec, i )
    {
        Vec_FltForEachEntry( vVec, Entry, k )
            fprintf( s, "%f%s", Entry, i == Vec_PtrSize(&p->vData)-1 && k == Vec_FltSize(vVec)-1 ? "\");":", " );
        if ( i == Vec_PtrSize(&p->vData)-1 )
            fprintf( s, "\n" );
        else
        {
            fprintf( s, "\\\n" );
            fprintf( s, "                   " );  
        }
    }
/*
    fprintf( s, "       approximations: \n" );
    fprintf( s, "       " );
    for ( i = 0; i < 3; i++ ) 
        fprintf( s, "%f ", p->approx[0][i] );
    fprintf( s, "\n" );
    fprintf( s, "       " );
    for ( i = 0; i < 4; i++ ) 
        fprintf( s, "%f ", p->approx[1][i] );
    fprintf( s, "\n" );
    fprintf( s, "       " );
    for ( i = 0; i < 6; i++ ) 
        fprintf( s, "%f ", p->approx[2][i] );
    fprintf( s, "\n" );
    fprintf( s, "       \n" );
*/
}